

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorUtils.H
# Opt level: O1

void __thiscall
pele::physics::reactions::utils::FlattenOps<pele::physics::reactions::utils::YCOrder>::flatten
          (FlattenOps<pele::physics::reactions::utils::YCOrder> *this,Box *box,int ncells,
          int reactor_type,bool clean_init_massfrac,Array4<const_double> *rhoY,
          Array4<const_double> *frcExt,Array4<const_double> *temperature,Array4<const_double> *rhoE,
          Array4<const_double> *frcEExt,Real *y_vect,Real *src_vect,Real *vect_energy,
          Real *src_vect_energy)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  anon_class_392_14_f0a3f212 local_1b8;
  
  local_1b8.lo.x = (box->smallend).vect[0];
  local_1b8.lo.y = (box->smallend).vect[1];
  local_1b8.len.x = ((box->bigend).vect[0] - (box->smallend).vect[0]) + 1;
  local_1b8.lo.z = (box->smallend).vect[2];
  local_1b8.len.z = ((box->bigend).vect[2] - local_1b8.lo.z) + 1;
  local_1b8.len.y = ((box->bigend).vect[1] - (box->smallend).vect[1]) + 1;
  local_1b8.rhoY.p = rhoY->p;
  local_1b8.rhoY.jstride = rhoY->jstride;
  local_1b8.rhoY.kstride = rhoY->kstride;
  local_1b8.rhoY.nstride = rhoY->nstride;
  local_1b8.rhoY.begin.x = (rhoY->begin).x;
  local_1b8.rhoY.begin.y = (rhoY->begin).y;
  uVar1 = *(undefined8 *)&(rhoY->begin).z;
  uVar2 = (rhoY->end).y;
  local_1b8.rhoY._52_8_ = *(undefined8 *)&(rhoY->end).z;
  local_1b8.rhoY.begin.z = (int)uVar1;
  local_1b8.rhoY.end.x = (int)((ulong)uVar1 >> 0x20);
  local_1b8.frcExt.p = frcExt->p;
  local_1b8.frcExt.jstride = frcExt->jstride;
  local_1b8.frcExt.kstride = frcExt->kstride;
  local_1b8.frcExt.nstride = frcExt->nstride;
  local_1b8.frcExt.begin.x = (frcExt->begin).x;
  local_1b8.frcExt.begin.y = (frcExt->begin).y;
  uVar1 = *(undefined8 *)&(frcExt->begin).z;
  uVar3 = (frcExt->end).y;
  local_1b8.frcExt._52_8_ = *(undefined8 *)&(frcExt->end).z;
  local_1b8.frcExt.begin.z = (int)uVar1;
  local_1b8.frcExt.end.x = (int)((ulong)uVar1 >> 0x20);
  local_1b8.temperature.p = temperature->p;
  local_1b8.temperature.jstride = temperature->jstride;
  local_1b8.temperature.kstride = temperature->kstride;
  local_1b8.temperature.nstride = temperature->nstride;
  local_1b8.temperature.begin.x = (temperature->begin).x;
  local_1b8.temperature.begin.y = (temperature->begin).y;
  uVar1 = *(undefined8 *)&(temperature->begin).z;
  uVar4 = (temperature->end).y;
  local_1b8.temperature._52_8_ = *(undefined8 *)&(temperature->end).z;
  local_1b8.temperature.begin.z = (int)uVar1;
  local_1b8.temperature.end.x = (int)((ulong)uVar1 >> 0x20);
  local_1b8.rhoE.p = rhoE->p;
  local_1b8.rhoE.jstride = rhoE->jstride;
  local_1b8.rhoE.kstride = rhoE->kstride;
  local_1b8.rhoE.nstride = rhoE->nstride;
  local_1b8.rhoE.begin.x = (rhoE->begin).x;
  local_1b8.rhoE.begin.y = (rhoE->begin).y;
  uVar1 = *(undefined8 *)&(rhoE->begin).z;
  uVar5 = (rhoE->end).y;
  local_1b8.rhoE._52_8_ = *(undefined8 *)&(rhoE->end).z;
  local_1b8.rhoE.begin.z = (int)uVar1;
  local_1b8.rhoE.end.x = (int)((ulong)uVar1 >> 0x20);
  local_1b8.frcEExt.p = frcEExt->p;
  local_1b8.frcEExt.jstride = frcEExt->jstride;
  local_1b8.frcEExt.kstride = frcEExt->kstride;
  local_1b8.frcEExt.nstride = frcEExt->nstride;
  local_1b8.frcEExt.begin.x = (frcEExt->begin).x;
  local_1b8.frcEExt.begin.y = (frcEExt->begin).y;
  uVar1 = *(undefined8 *)&(frcEExt->begin).z;
  uVar6 = (frcEExt->end).y;
  local_1b8.frcEExt._52_8_ = *(undefined8 *)&(frcEExt->end).z;
  local_1b8.frcEExt.begin.z = (int)uVar1;
  local_1b8.frcEExt.end.x = (int)((ulong)uVar1 >> 0x20);
  local_1b8.y_vect = y_vect;
  local_1b8.src_vect = src_vect;
  local_1b8.vect_energy = vect_energy;
  local_1b8.src_vect_energy = src_vect_energy;
  local_1b8.ncells = ncells;
  local_1b8.reactor_type = reactor_type;
  local_1b8.clean_init_massfrac = clean_init_massfrac;
  local_1b8.rhoY.end.y = uVar2;
  local_1b8.frcExt.end.y = uVar3;
  local_1b8.temperature.end.y = uVar4;
  local_1b8.rhoE.end.y = uVar5;
  local_1b8.frcEExt.end.y = uVar6;
  amrex::
  ParallelFor<pele::physics::reactions::utils::FlattenOps<pele::physics::reactions::utils::YCOrder>::flatten(amrex::Box_const&,int,int,bool,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double*,double*,double*,double*)::_lambda(int,int,int)_1_>
            (box,&local_1b8);
  return;
}

Assistant:

void flatten(
    const amrex::Box& box,
    const int ncells,
    const int reactor_type,
    const bool clean_init_massfrac,
    amrex::Array4<const amrex::Real> const& rhoY,
    amrex::Array4<const amrex::Real> const& frcExt,
    amrex::Array4<const amrex::Real> const& temperature,
    amrex::Array4<const amrex::Real> const& rhoE,
    amrex::Array4<const amrex::Real> const& frcEExt,
    amrex::Real* y_vect,
    amrex::Real* src_vect,
    amrex::Real* vect_energy,
    amrex::Real* src_vect_energy)
  {
    BL_PROFILE("Pele::flatten()");
    const auto len = amrex::length(box);
    const auto lo = amrex::lbound(box);
    amrex::ParallelFor(box, [=] AMREX_GPU_DEVICE(int i, int j, int k) noexcept {
      const int icell =
        (k - lo.z) * len.x * len.y + (j - lo.y) * len.x + (i - lo.x);
      box_flatten<OrderType>(
        icell, i, j, k, ncells, reactor_type, clean_init_massfrac, rhoY, frcExt,
        temperature, rhoE, frcEExt, y_vect, src_vect, vect_energy,
        src_vect_energy);
    });
  }